

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::_q_kineticScrollingFinished(AbstractScrollArea *this)

{
  AbstractScrollAreaPrivate *pAVar1;
  AbstractScrollArea *this_local;
  
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  if ((((pAVar1->horIndicator->needPaint & 1U) != 0) ||
      (pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                ::operator->(&this->d), (pAVar1->vertIndicator->needPaint & 1U) != 0)) &&
     ((pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                ::operator->(&this->d), pAVar1->horIndicator->policy == ScrollIndicatorAsNeeded ||
      (pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
                ::operator->(&this->d), pAVar1->vertIndicator->policy == ScrollIndicatorAsNeeded))))
  {
    pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
             ::operator->(&this->d);
    AbstractScrollAreaPrivate::animateScrollIndicators(pAVar1);
  }
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::animateHiddingBlurEffect(pAVar1);
  return;
}

Assistant:

void
AbstractScrollArea::_q_kineticScrollingFinished()
{
	if( d->horIndicator->needPaint || d->vertIndicator->needPaint )
	{
		if( d->horIndicator->policy == ScrollIndicatorAsNeeded ||
			d->vertIndicator->policy == ScrollIndicatorAsNeeded )
				d->animateScrollIndicators();
	}

	d->animateHiddingBlurEffect();
}